

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O1

void __thiscall Costs::linReg(Costs *this,double *coeff,double *gtT,uint t,uint n)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar4 = 0.0;
  dVar7 = 0.0;
  dVar6 = 0.0;
  if (t + 2 < n + 1) {
    uVar1 = (ulong)(t + 2);
    iVar3 = ~t + n;
    do {
      dVar6 = dVar6 + gtT[uVar1];
      dVar7 = dVar7 + (double)(uVar1 & 0xffffffff) * gtT[uVar1];
      uVar1 = uVar1 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  uVar2 = n - t;
  dVar9 = (double)(uVar2 + 1) * (double)(uVar2 - 1) * (double)uVar2;
  dVar5 = (double)(t + 1 + n);
  dVar10 = (dVar5 * -6.0) / dVar9;
  dVar8 = dVar10 * dVar6 + (12.0 / dVar9) * dVar7;
  dVar7 = ((dVar5 * 3.0) / dVar9 + 1.0 / (double)uVar2) * dVar6 + dVar10 * dVar7;
  dVar6 = 0.0;
  if (t + 1 < n + 1) {
    uVar1 = (ulong)(t + 1);
    dVar5 = 0.0;
    dVar9 = 0.0;
    do {
      dVar6 = gtT[uVar1] - ((double)(uVar1 & 0xffffffff) * dVar8 + dVar7);
      dVar4 = dVar6;
      if (dVar6 <= dVar9) {
        dVar4 = dVar9;
      }
      if (dVar5 <= dVar6) {
        dVar6 = dVar5;
      }
      uVar1 = uVar1 + 1;
      uVar2 = uVar2 - 1;
      dVar5 = dVar6;
      dVar9 = dVar4;
    } while (uVar2 != 0);
  }
  *coeff = dVar8;
  coeff[1] = dVar8;
  coeff[2] = dVar6 + dVar7;
  coeff[3] = dVar4 + dVar7;
  return;
}

Assistant:

void Costs::linReg(double* coeff, double *gtT, unsigned int t, unsigned int n)
{
  double sum_gtT = 0;
  double sum_igtT = 0;
  for(unsigned int i = t + 2; i < n + 1; i++) // 0 in t + 1
  {
    sum_gtT = sum_gtT + gtT[i];
    sum_igtT = sum_igtT + i * gtT[i];
  }
  double prod3 = 1.0*(n-t)*(n-t-1)*(n-t+1);
  double sum3 = 1.0*(n+t+1);

  double slope = (-6*sum3/prod3)*sum_gtT + (12/prod3)*sum_igtT;
  double intercept =((1/(1.0*(n-t))) + 3*sum3/prod3)*sum_gtT - (6*sum3/prod3)*sum_igtT;

  double residuMax = 0;
  double residuMin = 0;

  for(unsigned int i = t + 1; i < n + 1; i++) // 0 in t + 1
  {
    if(gtT[i] - (slope*i + intercept) > residuMax){residuMax = gtT[i] - (slope*i + intercept);}
    if(gtT[i] - (slope*i + intercept) < residuMin){residuMin = gtT[i] - (slope*i + intercept);}
  }

  ///matrix of coefficients: Ap, Am, Gp, Gm
  coeff[0] = slope;
  coeff[1] = slope;
  coeff[2] = intercept + residuMin;
  coeff[3] = intercept + residuMax;
}